

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

ON_BrepLoop * __thiscall ON_BrepFace::Loop(ON_BrepFace *this,int lti)

{
  uint uVar1;
  ON_Brep *pOVar2;
  ON_BrepLoop *pOVar3;
  
  pOVar3 = (ON_BrepLoop *)0x0;
  if (((-1 < lti) && (pOVar2 = this->m_brep, pOVar2 != (ON_Brep *)0x0)) &&
     (lti < (this->m_li).m_count)) {
    uVar1 = (this->m_li).m_a[(uint)lti];
    pOVar3 = (pOVar2->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a +
             uVar1;
    if ((pOVar2->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
        (int)uVar1) {
      pOVar3 = (ON_BrepLoop *)0x0;
    }
    if ((int)uVar1 < 0) {
      pOVar3 = (ON_BrepLoop *)0x0;
    }
  }
  return pOVar3;
}

Assistant:

ON_BrepLoop* ON_BrepFace::Loop( int lti ) const
{
  return (m_brep && lti >= 0 && lti < m_li.Count()) ? m_brep->Loop( m_li[lti]) : 0;
}